

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

uint32_t ixgbe_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  long *plVar1;
  _Bool _Var2;
  pkt_buf *ppVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  pkt_buf *ppVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long extraout_RDX;
  ulong uVar16;
  ulong uVar17;
  long *plVar18;
  int iVar19;
  undefined6 in_register_00000032;
  undefined8 uVar20;
  long lVar21;
  ushort uVar22;
  ixy_device *mempool;
  ushort uVar23;
  ulong uVar24;
  uint uVar25;
  interrupt_queues *interrupt;
  ushort uStack_c4;
  
  uVar20 = CONCAT62(in_register_00000032,queue_id);
  _Var2 = (ixy->interrupts).interrupts_enabled;
  if (_Var2 == true) {
    interrupt = (ixy->interrupts).queues + queue_id;
  }
  else {
    interrupt = (interrupt_queues *)0x0;
  }
  mempool = ixy;
  if ((_Var2 != false) && (interrupt->interrupt_enabled == true)) {
    mempool = (ixy_device *)(ulong)(uint)interrupt->vfio_epoll_fd;
    uVar20 = 10;
    vfio_epoll_wait(interrupt->vfio_epoll_fd,10,(ixy->interrupts).timeout_ms);
  }
  plVar1 = (long *)(ixy[1].driver_name + (ulong)queue_id * 0x18);
  uVar23 = *(ushort *)((long)plVar1 + 0x12);
  uVar11 = (ulong)uVar23;
  uVar13 = (uint)uVar23;
  if (num_bufs == 0) {
    uVar17 = 0;
LAB_00105cf5:
    if (uVar23 != (ushort)uVar13) {
      uVar14 = (uint)queue_id * 0x40 + 0xc018;
      if (queue_id < 0x40) {
        uVar14 = (uint)queue_id * 0x40 | 0x1018;
      }
      *(uint *)(ixy[1].pci_addr + uVar14) = uVar13 & 0xffff;
      *(ushort *)((long)plVar1 + 0x12) = uVar23;
    }
    if (_Var2 != false) {
      uVar11 = interrupt->instr_counter;
      auVar6 = vpmovsxbq_avx(ZEXT216(0x101));
      auVar5 = vpinsrq_avx(auVar6,uVar17 & 0xffffffff,1);
      auVar6._0_8_ = interrupt->instr_counter;
      auVar6._8_8_ = interrupt->rx_pkts;
      auVar6 = vpaddq_avx(auVar5,auVar6);
      interrupt->instr_counter = auVar6._0_8_;
      interrupt->rx_pkts = auVar6._8_8_;
      if ((uVar11 & 0xfff) == 0) {
        _Var2 = interrupt->interrupt_enabled;
        uVar10 = monotonic_time();
        uVar11 = uVar10 - interrupt->last_time_checked;
        if (interrupt->interval < uVar11) {
          check_interrupt(interrupt,uVar11,(uint32_t)uVar17,num_bufs);
        }
        if (_Var2 != interrupt->interrupt_enabled) {
          if (interrupt->interrupt_enabled == false) {
            ixgbe_rx_batch_cold_3();
          }
          else {
            enable_interrupt((ixgbe_device *)ixy,queue_id);
          }
        }
      }
    }
    return (uint32_t)uVar17;
  }
  uVar16 = 0;
  uVar12 = uVar11;
  while( true ) {
    iVar19 = (int)uVar20;
    uVar17 = uVar12 & 0xffff;
    uVar13 = (int)uVar17 << 4;
    uVar14 = *(uint *)(*plVar1 + 8 + (ulong)uVar13);
    uVar24 = uVar12;
    if ((uVar14 & 1) != 0) break;
LAB_00105cd5:
    uVar23 = (ushort)uVar24;
    uVar13 = (uint)uVar11;
    uVar17 = uVar16;
    if (((uVar14 & 1) == 0) ||
       (uVar16 = uVar16 + 1, uVar17 = (ulong)num_bufs, uVar12 = uVar24, num_bufs == uVar16))
    goto LAB_00105cf5;
  }
  if ((uVar14 & 2) != 0) {
    plVar18 = (long *)(*plVar1 + (ulong)uVar13);
    uVar13 = (uint)*(ushort *)((long)plVar18 + 0xe);
    ppVar3 = (pkt_buf *)plVar1[uVar17 + 3];
    ppVar3->size = (uint)*(ushort *)((long)plVar18 + 0xc);
    mempool = (ixy_device *)plVar1[1];
    ppVar9 = pkt_buf_alloc((mempool *)mempool);
    iVar19 = (int)uVar20;
    if (ppVar9 != (pkt_buf *)0x0) {
      *plVar18 = ppVar9->buf_addr_phy + 0x40;
      plVar18[1] = 0;
      plVar1[uVar17 + 3] = (long)ppVar9;
      bufs[uVar16] = ppVar3;
      uVar24 = (ulong)((int)plVar1[2] - 1U & (int)uVar12 + 1U);
      uVar11 = uVar12;
      goto LAB_00105cd5;
    }
    ixgbe_rx_batch_cold_1();
  }
  ixgbe_rx_batch_cold_2();
  plVar1 = (long *)(*(long *)&mempool[1].num_rx_queues + (ulong)(uint)(iVar19 << 4));
  uVar14 = (uint)*(ushort *)(*(long *)&mempool[1].num_rx_queues + 10 + (ulong)(uint)(iVar19 << 4));
  do {
    uVar8 = uVar14 & 0xffff;
    iVar15 = *(ushort *)((long)plVar1 + 0xc) - uVar8;
    if (iVar15 < 0) {
      iVar15 = iVar15 + (uint)*(ushort *)(plVar1 + 1);
    }
    bVar7 = false;
    if (0x1f < iVar15) {
      uVar25 = (uint)*(ushort *)(plVar1 + 1);
      if (uVar8 + 0x1f < (uint)*(ushort *)(plVar1 + 1)) {
        uVar25 = 0;
      }
      uVar25 = (uVar8 + 0x1f) - uVar25;
      if ((*(uint *)(*plVar1 + 0xc + (long)(int)uVar25 * 0x10) & 1) != 0) {
        for (; pkt_buf_free((pkt_buf *)plVar1[(ulong)uVar8 + 2]), uVar8 != uVar25;
            uVar8 = (int)plVar1[1] - 1U & uVar8 + 1 & 0xffff) {
        }
        uVar14 = (int)plVar1[1] - 1U & uVar25 + 1;
        bVar7 = true;
      }
    }
  } while (bVar7);
  *(ushort *)((long)plVar1 + 10) = (ushort)uVar14;
  uVar12 = 0;
  uVar11 = uVar12;
  if (uVar13 != 0) {
    do {
      uVar23 = *(ushort *)((long)plVar1 + 0xc);
      uVar22 = (short)(int)plVar1[1] - 1U & uVar23 + 1;
      uVar11 = uVar12;
      if ((ushort)uVar14 == uVar22) break;
      plVar18 = *(long **)(extraout_RDX + uVar12 * 8);
      plVar1[(ulong)uVar23 + 2] = (long)plVar18;
      lVar4 = *plVar1;
      lVar21 = (ulong)uVar23 * 0x10;
      *(ushort *)((long)plVar1 + 0xc) = uVar22;
      *(long *)(lVar4 + lVar21) = *plVar18 + 0x40;
      *(uint *)(lVar4 + 8 + lVar21) = *(uint *)((long)plVar18 + 0x14) | 0x2b300000;
      *(int *)(lVar4 + 0xc + lVar21) = *(int *)((long)plVar18 + 0x14) << 0xe;
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)uVar13;
    } while (uVar13 != uVar12);
  }
  uStack_c4 = (ushort)iVar19;
  *(uint *)(mempool[1].pci_addr + (ulong)uStack_c4 * 0x40 + 0x6018) =
       (uint)*(ushort *)((long)plVar1 + 0xc);
  return (uint32_t)uVar11;
}

Assistant:

uint32_t ixgbe_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	struct interrupt_queues* interrupt = NULL;
	bool interrupts_enabled = ixy->interrupts.interrupts_enabled;

	if (interrupts_enabled) {
		interrupt = &ixy->interrupts.queues[queue_id];
	}

	if (interrupts_enabled && interrupt->interrupt_enabled) {
		vfio_epoll_wait(interrupt->vfio_epoll_fd, 10, dev->ixy.interrupts.timeout_ms);
	}

	struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*) (dev->rx_queues)) + queue_id;
	uint16_t rx_index = queue->rx_index; // rx index we checked in the last run of this function
	uint16_t last_rx_index = rx_index; // index of the descriptor we checked in the last iteration of the loop
	uint32_t buf_index;
	for (buf_index = 0; buf_index < num_bufs; buf_index++) {
		// rx descriptors are explained in 7.1.5
		volatile union ixgbe_adv_rx_desc* desc_ptr = queue->descriptors + rx_index;
		uint32_t status = desc_ptr->wb.upper.status_error;
		if (status & IXGBE_RXDADV_STAT_DD) {
			if (!(status & IXGBE_RXDADV_STAT_EOP)) {
				error("multi-segment packets are not supported - increase buffer size or decrease MTU");
			}
			// got a packet, read and copy the whole descriptor
			union ixgbe_adv_rx_desc desc = *desc_ptr;
			struct pkt_buf* buf = (struct pkt_buf*) queue->virtual_addresses[rx_index];
			buf->size = desc.wb.upper.length;
			// this would be the place to implement RX offloading by translating the device-specific flags
			// to an independent representation in the buf (similiar to how DPDK works)
			// need a new mbuf for the descriptor
			struct pkt_buf* new_buf = pkt_buf_alloc(queue->mempool);
			if (!new_buf) {
				// we could handle empty mempools more gracefully here, but it would be quite messy...
				// make your mempools large enough
				error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
			}
			// reset the descriptor
			desc_ptr->read.pkt_addr = new_buf->buf_addr_phy + offsetof(struct pkt_buf, data);
			desc_ptr->read.hdr_addr = 0; // this resets the flags
			queue->virtual_addresses[rx_index] = new_buf;
			bufs[buf_index] = buf;
			// want to read the next one in the next iteration, but we still need the last/current to update RDT later
			last_rx_index = rx_index;
			rx_index = wrap_ring(rx_index, queue->num_entries);
		} else {
			break;
		}
	}
	if (rx_index != last_rx_index) {
		// tell hardware that we are done
		// this is intentionally off by one, otherwise we'd set RDT=RDH if we are receiving faster than packets are coming in
		// RDT=RDH means queue is full
		set_reg32(dev->addr, IXGBE_RDT(queue_id), last_rx_index);
		queue->rx_index = rx_index;
	}

	if (interrupts_enabled) {
		interrupt->rx_pkts += buf_index;

		if ((interrupt->instr_counter++ & 0xFFF) == 0) {
			bool int_en = interrupt->interrupt_enabled;
			uint64_t diff = monotonic_time() - interrupt->last_time_checked;
			if (diff > interrupt->interval) {
				// every second
				check_interrupt(interrupt, diff, buf_index, num_bufs);
			}

			if (int_en != interrupt->interrupt_enabled) {
				if (interrupt->interrupt_enabled) {
					enable_interrupt(dev, queue_id);
				} else {
					disable_interrupt(dev, queue_id);
				}
			}
		}
	}

	return buf_index; // number of packets stored in bufs; buf_index points to the next index
}